

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O3

jstring Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1rstate_1get
                  (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_)

{
  jstring p_Var1;
  
  if (*(char **)(jarg1 + 0x48) != (char *)0x0) {
    p_Var1 = (*jenv->functions->NewStringUTF)(jenv,*(char **)(jarg1 + 0x48));
    return p_Var1;
  }
  return (jstring)0x0;
}

Assistant:

SWIGEXPORT jstring JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1rstate_1get(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_) {
  jstring jresult = 0 ;
  opt_s *arg1 = (opt_s *) 0 ;
  char *result = 0 ;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  result = (char *) ((arg1)->rstate);
  if (result) jresult = jenv->NewStringUTF((const char *)result);
  return jresult;
}